

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O0

void absl::lts_20250127::internal_any_invocable::RemoteManagerTrivial
               (FunctionToCall operation,TypeErasedState *from,TypeErasedState *to)

{
  TypeErasedState *to_local;
  TypeErasedState *from_local;
  FunctionToCall operation_local;
  
  if ((operation & dispose) == relocate_from_to) {
    (to->remote).target = (from->remote).target;
    (to->remote).size = (from->remote).size;
  }
  else {
    operator_delete((from->remote).target,(from->remote).size);
  }
  return;
}

Assistant:

inline void RemoteManagerTrivial(FunctionToCall operation,
                                 TypeErasedState* const from,
                                 TypeErasedState* const to) noexcept {
  switch (operation) {
    case FunctionToCall::relocate_from_to:
      // NOTE: Requires that the left-hand operand is already empty.
      to->remote = from->remote;
      return;
    case FunctionToCall::dispose:
#if defined(__cpp_sized_deallocation)
      ::operator delete(from->remote.target, from->remote.size);
#else   // __cpp_sized_deallocation
      ::operator delete(from->remote.target);
#endif  // __cpp_sized_deallocation
      return;
  }
  ABSL_UNREACHABLE();
}